

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_sections_17(void)

{
  run("implicit iterators should cast decimals to strings and interpolate",
      "\"{{#list}}({{.}}){{/list}}\"","{\"list\": [1.1, 2.2, 3.3, 4.4, 5.5]}",(char *)0x0,
      "\"(1.1)(2.2)(3.3)(4.4)(5.5)\"");
  return;
}

Assistant:

static void
test_sections_17(void)
{
    run(
        "implicit iterators should cast decimals to strings and interpolate",
        "\"{{#list}}({{.}}){{/list}}\"",
        "{\"list\": [1.1, 2.2, 3.3, 4.4, 5.5]}",
        NULL,
        "\"(1.1)(2.2)(3.3)(4.4)(5.5)\""
    );
}